

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O3

void __thiscall Map::Country::operator=(Country *this,Country *rhs)

{
  string *psVar1;
  int *piVar2;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"In country = operator:",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(rhs->cyName->_M_dataplus)._M_p,rhs->cyName->_M_string_length);
  psVar1 = rhs->cyName;
  this->cyID = rhs->cyID;
  this->cyName = psVar1;
  piVar2 = rhs->pPlayerOwnerId;
  this->cyContinent = rhs->cyContinent;
  this->pPlayerOwnerId = piVar2;
  pvVar3 = rhs->pAdjCountries;
  this->pNumberOfTroops = rhs->pNumberOfTroops;
  this->pAdjCountries = pvVar3;
  return;
}

Assistant:

void Map::Country::operator=(Map::Country& rhs){
    std::cout << "In country = operator:" << *rhs.cyName;
    this->cyID = rhs.cyID;
    this->cyName = rhs.cyName;
    this->cyContinent = rhs.cyContinent;
    this->pPlayerOwnerId = rhs.pPlayerOwnerId;
    this->pNumberOfTroops = rhs.pNumberOfTroops;
    this->pAdjCountries = rhs.pAdjCountries;
}